

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxNodeHeap.h
# Opt level: O2

void __thiscall maxNodeHeap::insert(maxNodeHeap *this,NodeID node,Gain gain)

{
  pointer pQVar1;
  pointer pQVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type mVar5;
  int pos;
  NodeID node_local;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_50;
  QElement<maxNodeHeap::Data> local_48;
  
  node_local = node;
  iVar3 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_element_index)._M_h,&node_local);
  if (iVar3.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur == (__node_type *)0x0
     ) {
    pQVar1 = (this->m_elements).
             super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pQVar2 = (this->m_elements).
             super__Vector_base<QElement<maxNodeHeap::Data>,_std::allocator<QElement<maxNodeHeap::Data>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->m_heap;
    local_48._vptr_QElement = (_func_int **)&PTR__QElement_00128d70;
    local_48.m_data.node = node_local;
    pos = (int)((ulong)((long)(this->m_heap).
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_heap).
                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
    local_48.m_key = gain;
    local_48.m_index = pos;
    std::vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>>::
    emplace_back<QElement<maxNodeHeap::Data>>
              ((vector<QElement<maxNodeHeap::Data>,std::allocator<QElement<maxNodeHeap::Data>>> *)
               &this->m_elements,&local_48);
    mVar5 = (mapped_type)(((long)pQVar1 - (long)pQVar2) / 0x18);
    local_48._vptr_QElement = (_func_int **)CONCAT44(mVar5,gain);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>(local_50,(pair<int,_int> *)&local_48);
    pmVar4 = std::__detail::
             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->m_element_index,&node_local);
    *pmVar4 = mVar5;
    siftUp(this,pos);
  }
  return;
}

Assistant:

inline void maxNodeHeap::insert(NodeID node, Gain gain) {
        if( m_element_index.find(node) == m_element_index.end() ) {
                int element_index =  m_elements.size();
                int heap_size     =  m_heap.size();

                m_elements.push_back( PQElement( Data(node), gain, heap_size) );
                m_heap.push_back( std::pair< Key, int>(gain, element_index) );
                m_element_index[node] = element_index;
                siftUp( heap_size );
        }
}